

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O3

bool duckdb::ApplyBloomFilter(TableFilter *duckdb_filter,ParquetBloomFilter *bloom_filter)

{
  TableFilterType TVar1;
  char cVar2;
  PhysicalType PVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  ConstantFilter *pCVar8;
  Value *this;
  ConjunctionOrFilter *pCVar9;
  type pTVar10;
  ConjunctionAndFilter *pCVar11;
  unsigned_long_long uVar12;
  pointer pRVar13;
  size_t len;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer puVar14;
  float fVar15;
  double val;
  string local_40;
  
  TVar1 = duckdb_filter->filter_type;
  if (TVar1 == CONJUNCTION_AND) {
    pCVar11 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(duckdb_filter);
    puVar14 = (pCVar11->super_ConjunctionFilter).child_filters.
              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (pCVar11->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar14 != puVar4) {
      bVar6 = false;
      do {
        pTVar10 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(puVar14);
        bVar5 = ApplyBloomFilter(pTVar10,bloom_filter);
        bVar6 = (bool)(bVar6 | bVar5);
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar4);
      return bVar6;
    }
    goto LAB_01b60131;
  }
  if (TVar1 == CONJUNCTION_OR) {
    pCVar9 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(duckdb_filter);
    puVar4 = (pCVar9->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = true;
    for (puVar14 = (pCVar9->super_ConjunctionFilter).child_filters.
                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar4;
        puVar14 = puVar14 + 1) {
      pTVar10 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(puVar14);
      bVar5 = ApplyBloomFilter(pTVar10,bloom_filter);
      bVar6 = (bool)(bVar6 & bVar5);
    }
    return bVar6;
  }
  if (TVar1 != CONSTANT_COMPARISON) goto LAB_01b60131;
  pCVar8 = TableFilter::Cast<duckdb::ConstantFilter>(duckdb_filter);
  cVar2 = (pCVar8->super_TableFilter).field_0x9;
  PVar3 = (pCVar8->constant).type_.physical_type_;
  this = &pCVar8->constant;
  bVar6 = false;
  switch(PVar3) {
  case UINT8:
  case INT8:
  case UINT16:
  case INT16:
  case INT32:
    uVar7 = Value::GetValue<int>(this);
    goto LAB_01b5ffe6;
  case UINT32:
    uVar7 = Value::GetValue<unsigned_int>(this);
LAB_01b5ffe6:
    local_40._M_dataplus._M_p._0_4_ = (float)uVar7;
LAB_01b5ffed:
    len = 4;
    goto LAB_01b600e9;
  case UINT64:
    local_40._M_dataplus._M_p = (pointer)Value::GetValue<unsigned_long>(this);
    break;
  case INT64:
    local_40._M_dataplus._M_p = (pointer)Value::GetValue<long>(this);
    break;
  case UINT64|UINT8:
    goto switchD_01b5ffdc_caseD_a;
  case FLOAT:
    fVar15 = Value::GetValue<float>(this);
    local_40._M_dataplus._M_p._0_4_ = fVar15;
    goto LAB_01b5ffed;
  case DOUBLE:
    local_40._M_dataplus._M_p = (pointer)Value::GetValue<double>(this);
    break;
  default:
    if (PVar3 != VARCHAR) {
      return false;
    }
    Value::GetValue<std::__cxx11::string>(&local_40,this);
    uVar12 = duckdb_zstd::XXH64(local_40._M_dataplus._M_p,local_40._M_string_length,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    goto LAB_01b600f3;
  }
  len = 8;
LAB_01b600e9:
  uVar12 = duckdb_zstd::XXH64(&local_40,len,0);
LAB_01b600f3:
  if (uVar12 == 0) {
LAB_01b60131:
    bVar6 = false;
  }
  else {
    pRVar13 = unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>,_true>
              ::operator->(&bloom_filter->data);
    bVar6 = ParquetBloomBlock::BlockCheck
                      ((ParquetBloomBlock *)
                       ((pRVar13->super_ByteBuffer).ptr +
                       ((uVar12 >> 0x20) * bloom_filter->block_count >> 0x1b & 0xffffffffffffffe0)),
                       (uint32_t)uVar12);
    bVar6 = (bool)(~bVar6 & cVar2 == '\x19');
  }
switchD_01b5ffdc_caseD_a:
  return bVar6;
}

Assistant:

static bool ApplyBloomFilter(const TableFilter &duckdb_filter, ParquetBloomFilter &bloom_filter) {
	switch (duckdb_filter.filter_type) {
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = duckdb_filter.Cast<ConstantFilter>();
		auto is_compare_equal = constant_filter.comparison_type == ExpressionType::COMPARE_EQUAL;
		D_ASSERT(!constant_filter.constant.IsNull());
		auto hash = ValueXXH64(constant_filter.constant);
		return hash > 0 && !bloom_filter.FilterCheck(hash) && is_compare_equal;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and_filter = duckdb_filter.Cast<ConjunctionAndFilter>();
		bool any_children_true = false;
		for (auto &child_filter : conjunction_and_filter.child_filters) {
			any_children_true |= ApplyBloomFilter(*child_filter, bloom_filter);
		}
		return any_children_true;
	}
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction_or_filter = duckdb_filter.Cast<ConjunctionOrFilter>();
		bool all_children_true = true;
		for (auto &child_filter : conjunction_or_filter.child_filters) {
			all_children_true &= ApplyBloomFilter(*child_filter, bloom_filter);
		}
		return all_children_true;
	}
	default:
		return false;
	}
}